

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parse::Object::setDimencionRequest(Object *this,string *anchor,string *size)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  Size *pSVar4;
  
  if (this->dimencions == (Size *)0x0) {
    pSVar4 = (Size *)operator_new(0x40);
    (pSVar4->height)._M_dataplus._M_p = (pointer)0x0;
    (pSVar4->height)._M_string_length = 0;
    (pSVar4->height).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar4->height).field_2 + 8) = 0;
    (pSVar4->width).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar4->width).field_2 + 8) = 0;
    (pSVar4->width)._M_dataplus._M_p = (pointer)&(pSVar4->width).field_2;
    (pSVar4->width)._M_string_length = 0;
    (pSVar4->height)._M_dataplus._M_p = (pointer)&(pSVar4->height).field_2;
    (pSVar4->height).field_2._M_local_buf[0] = '\0';
    this->dimencions = pSVar4;
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 == 0) {
    pcVar1 = (size->_M_dataplus)._M_p;
    pSVar4 = this->dimencions;
    pcVar2 = (char *)(pSVar4->width)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)pSVar4,0,pcVar2,(ulong)pcVar1);
  }
  iVar3 = std::__cxx11::string::compare((char *)anchor);
  if (iVar3 != 0) {
    return;
  }
  pcVar1 = (size->_M_dataplus)._M_p;
  pSVar4 = this->dimencions;
  pcVar2 = (char *)(pSVar4->height)._M_string_length;
  strlen(pcVar1);
  std::__cxx11::string::_M_replace((ulong)&pSVar4->height,0,pcVar2,(ulong)pcVar1);
  return;
}

Assistant:

void setDimencionRequest(std::string anchor, std::string size) {
                if (dimencions == NULL) {
                    dimencions = new Size();
                }
                if (anchor == "width_request") {
                    dimencions->width = (size.c_str());
                }
                if (anchor == "width_request") {
                    dimencions->height = (size.c_str());
                }
            }